

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void processHEL(UA_Connection *connection,UA_ByteString *msg,size_t *offset)

{
  UA_StatusCode UVar1;
  size_t local_88;
  size_t tmpPos;
  undefined1 auStack_78 [4];
  UA_StatusCode retval;
  UA_ByteString ack_msg;
  UA_TcpMessageHeader ackHeader;
  UA_TcpAcknowledgeMessage ackMessage;
  UA_TcpHelloMessage helloMessage;
  size_t *offset_local;
  UA_ByteString *msg_local;
  UA_Connection *connection_local;
  
  UVar1 = UA_TcpHelloMessage_decodeBinary
                    (msg,offset,(UA_TcpHelloMessage *)&ackMessage.maxMessageSize);
  if (UVar1 == 0) {
    (connection->remoteConf).maxChunkCount = helloMessage.sendBufferSize;
    (connection->remoteConf).maxMessageSize = helloMessage.receiveBufferSize;
    (connection->remoteConf).protocolVersion = ackMessage.maxMessageSize;
    (connection->remoteConf).recvBufferSize = ackMessage.maxChunkCount;
    if (ackMessage.maxChunkCount < (connection->localConf).sendBufferSize) {
      (connection->localConf).sendBufferSize = ackMessage.maxChunkCount;
    }
    (connection->remoteConf).sendBufferSize = helloMessage.protocolVersion;
    if (helloMessage.protocolVersion < (connection->localConf).recvBufferSize) {
      (connection->localConf).recvBufferSize = helloMessage.protocolVersion;
    }
    connection->state = UA_CONNECTION_ESTABLISHED;
    UA_TcpHelloMessage_deleteMembers((UA_TcpHelloMessage *)&ackMessage.maxMessageSize);
    ackHeader.messageTypeAndChunkType = (connection->localConf).protocolVersion;
    ackHeader.messageSize = (connection->localConf).recvBufferSize;
    ackMessage.protocolVersion = (connection->localConf).sendBufferSize;
    ackMessage.receiveBufferSize = (connection->localConf).maxMessageSize;
    ackMessage.sendBufferSize = (connection->localConf).maxChunkCount;
    ack_msg.data._4_4_ = 0x464b4341;
    UA_ByteString_init((UA_ByteString *)auStack_78);
    tmpPos._4_4_ = (*connection->getSendBuffer)
                             (connection,(size_t)(connection->localConf).sendBufferSize,
                              (UA_ByteString *)auStack_78);
    if (tmpPos._4_4_ == 0) {
      local_88 = 0;
      UA_TcpMessageHeader_encodeBinary
                ((UA_TcpMessageHeader *)((long)&ack_msg.data + 4),(UA_ByteString *)auStack_78,
                 &local_88);
      UA_TcpAcknowledgeMessage_encodeBinary
                ((UA_TcpAcknowledgeMessage *)&ackHeader,(UA_ByteString *)auStack_78,&local_88);
      _auStack_78 = 0x1c;
      (*connection->send)(connection,(UA_ByteString *)auStack_78);
    }
  }
  else {
    (*connection->close)(connection);
  }
  return;
}

Assistant:

static void processHEL(UA_Connection *connection, const UA_ByteString *msg, size_t *offset) {
    UA_TcpHelloMessage helloMessage;
    if(UA_TcpHelloMessage_decodeBinary(msg, offset, &helloMessage) != UA_STATUSCODE_GOOD) {
        connection->close(connection);
        return;
    }

    /* Parameterize the connection */
    connection->remoteConf.maxChunkCount = helloMessage.maxChunkCount; /* zero -> unlimited */
    connection->remoteConf.maxMessageSize = helloMessage.maxMessageSize; /* zero -> unlimited */
    connection->remoteConf.protocolVersion = helloMessage.protocolVersion;
    connection->remoteConf.recvBufferSize = helloMessage.receiveBufferSize;
    if(connection->localConf.sendBufferSize > helloMessage.receiveBufferSize)
        connection->localConf.sendBufferSize = helloMessage.receiveBufferSize;
    connection->remoteConf.sendBufferSize = helloMessage.sendBufferSize;
    if(connection->localConf.recvBufferSize > helloMessage.sendBufferSize)
        connection->localConf.recvBufferSize = helloMessage.sendBufferSize;
    connection->state = UA_CONNECTION_ESTABLISHED;
    UA_TcpHelloMessage_deleteMembers(&helloMessage);

    /* Build acknowledge response */
    UA_TcpAcknowledgeMessage ackMessage;
    ackMessage.protocolVersion = connection->localConf.protocolVersion;
    ackMessage.receiveBufferSize = connection->localConf.recvBufferSize;
    ackMessage.sendBufferSize = connection->localConf.sendBufferSize;
    ackMessage.maxMessageSize = connection->localConf.maxMessageSize;
    ackMessage.maxChunkCount = connection->localConf.maxChunkCount;

    UA_TcpMessageHeader ackHeader;
    ackHeader.messageTypeAndChunkType = UA_MESSAGETYPE_ACK + UA_CHUNKTYPE_FINAL;
    ackHeader.messageSize = 8 + 20; /* ackHeader + ackMessage */

    /* Get the send buffer from the network layer */
    UA_ByteString ack_msg;
    UA_ByteString_init(&ack_msg);
    UA_StatusCode retval =
        connection->getSendBuffer(connection, connection->localConf.sendBufferSize, &ack_msg);
    if(retval != UA_STATUSCODE_GOOD)
        return;

    /* Encode and send the response */
    size_t tmpPos = 0;
    UA_TcpMessageHeader_encodeBinary(&ackHeader, &ack_msg, &tmpPos);
    UA_TcpAcknowledgeMessage_encodeBinary(&ackMessage, &ack_msg, &tmpPos);
    ack_msg.length = ackHeader.messageSize;
    connection->send(connection, &ack_msg);
}